

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles3v(json_service *this,vector<int,_std::allocator<int>_> *f)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  runtime_error *this_00;
  vector<int,_std::allocator<int>_> *in_RSI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (sVar1 == 2) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
    if (*pvVar2 == 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,1);
      if (*pvVar2 == 2) {
        return;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = std::operator<<((ostream *)local_188,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,99);
  std::operator<<(poVar3," f.size()==2 && f[0]==1 && f[1]==2");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles3v(std::vector<int> f) {  TEST(f.size()==2 && f[0]==1 && f[1]==2); }